

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint64_t farmhash64_xo(char *s,size_t len)

{
  ulong in_RSI;
  char *in_RDI;
  char *in_stack_00000010;
  size_t in_stack_00000028;
  char *in_stack_00000030;
  char *in_stack_00000038;
  size_t in_stack_000000f0;
  char *in_stack_000000f8;
  undefined8 local_8;
  
  if (in_RSI < 0x21) {
    if (in_RSI < 0x11) {
      local_8 = farmhash_na_len_0_to_16(in_stack_00000038,(size_t)in_stack_00000030);
    }
    else {
      local_8 = farmhash_na_len_17_to_32(in_stack_00000030,in_stack_00000028);
    }
  }
  else if (in_RSI < 0x41) {
    local_8 = farmhash_xo_len_33_to_64(in_stack_00000010,(size_t)s);
  }
  else if (in_RSI < 0x61) {
    local_8 = farmhash_xo_len_65_to_96(in_stack_00000010,(size_t)s);
  }
  else if (in_RSI < 0x101) {
    local_8 = farmhash64_na(in_stack_000000f8,in_stack_000000f0);
  }
  else {
    local_8 = farmhash64_uo(in_RDI,in_RSI);
  }
  return local_8;
}

Assistant:

uint64_t farmhash64_xo(const char *s, size_t len) {
  if (len <= 32) {
    if (len <= 16) {
      return farmhash_na_len_0_to_16(s, len);
    } else {
      return farmhash_na_len_17_to_32(s, len);
    }
  } else if (len <= 64) {
    return farmhash_xo_len_33_to_64(s, len);
  } else if (len <= 96) {
    return farmhash_xo_len_65_to_96(s, len);
  } else if (len <= 256) {
    return farmhash64_na(s, len);
  } else {
    return farmhash64_uo(s, len);
  }
}